

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

QSize __thiscall QToolBarLayout::expandedSize(QToolBarLayout *this,QSize *size)

{
  bool bVar1;
  Orientation OVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QToolBar *pQVar7;
  QMainWindow *pQVar8;
  QStyle *pQVar9;
  qsizetype qVar10;
  const_reference pQVar11;
  int *piVar12;
  const_reference ppQVar13;
  undefined4 extraout_var;
  Orientation *pOVar14;
  long *in_RDI;
  long in_FS_OFFSET;
  double dVar15;
  int newSize;
  int prev;
  int count_1;
  int i;
  int h;
  int rows;
  int x;
  int count;
  int total_w;
  int extensionExtent;
  int spacing;
  int handleExtent;
  QStyle *style;
  Orientation o;
  QMainWindow *win;
  QToolBar *tb;
  int rowHeight;
  int size_1;
  int w;
  int space;
  int min_w;
  QMargins margins;
  QSize result;
  QStyleOptionToolBar opt;
  QWidget *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  Orientation in_stack_fffffffffffffe84;
  Orientation in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  Orientation in_stack_fffffffffffffe94;
  int local_168;
  int local_13c;
  int local_12c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_100;
  int local_fc;
  int local_f8;
  QToolBarLayout *in_stack_ffffffffffffff28;
  int local_ac;
  undefined8 local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  QSize local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 local_78 [16];
  QSize local_68;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 9) & 1) != 0) {
    updateGeomArray(in_stack_ffffffffffffff28);
  }
  QLayout::parentWidget((QLayout *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  pQVar7 = qobject_cast<QToolBar*>((QObject *)0x6fc29b);
  if (pQVar7 == (QToolBar *)0x0) {
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78);
  }
  else {
    QWidget::parentWidget((QWidget *)0x6fc2d1);
    pQVar8 = qobject_cast<QMainWindow*>((QObject *)0x6fc2d9);
    OVar2 = QToolBar::orientation
                      ((QToolBar *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    pQVar9 = QWidget::style(in_stack_fffffffffffffe78);
    memset(local_60,0xaa,0x58);
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6fc32e);
    (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a0))(pQVar7,local_60);
    bVar1 = movable((QToolBarLayout *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
    ;
    if (bVar1) {
      local_12c = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x35,local_60,pQVar7);
    }
    else {
      local_12c = 0;
    }
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [16])
               QLayout::contentsMargins
                         ((QLayout *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    iVar3 = (**(code **)(*in_RDI + 0x60))();
    iVar4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x39,local_60,pQVar7);
    local_f8 = 0;
    local_fc = 0;
    for (local_100 = 0; qVar10 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4)),
        local_100 < qVar10; local_100 = local_100 + 1) {
      pQVar11 = QList<QLayoutStruct>::operator[]
                          ((QList<QLayoutStruct> *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           (qsizetype)in_stack_fffffffffffffe78);
      if ((pQVar11->empty & 1U) == 0) {
        local_13c = iVar3;
        if (local_fc == 0) {
          local_13c = 0;
        }
        pQVar11 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             (qsizetype)in_stack_fffffffffffffe78);
        local_f8 = local_13c + pQVar11->minimumSize + local_f8;
        local_fc = local_fc + 1;
      }
    }
    if (local_fc == 0) {
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78);
    }
    else {
      local_7c = pick(in_stack_fffffffffffffe84,(QSize *)in_stack_fffffffffffffe78);
      dVar15 = qSqrt<double>(3.61902986765584e-317);
      iVar6 = local_7c;
      local_108 = (int)dVar15;
      if (local_108 == 1) {
        local_108 = 2;
      }
      local_80 = local_f8 / local_108 + iVar3 + iVar4;
      iVar5 = pick(in_stack_fffffffffffffe94,
                   (QMargins *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_84 = (iVar6 - iVar5) - local_12c;
      piVar12 = qMax<int>(&local_80,&local_84);
      local_80 = *piVar12;
      if (pQVar8 != (QMainWindow *)0x0) {
        local_90 = QWidget::size(in_stack_fffffffffffffe78);
        iVar6 = pick(in_stack_fffffffffffffe84,(QSize *)in_stack_fffffffffffffe78);
        iVar5 = pick(in_stack_fffffffffffffe94,
                     (QMargins *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_88 = (iVar6 - iVar5) - local_12c;
        piVar12 = qMin<int>(&local_80,&local_88);
        local_80 = *piVar12;
      }
      local_94 = 0;
      local_10c = 0;
      local_110 = 0;
      while (qVar10 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4)),
            local_110 < qVar10) {
        local_114 = 0;
        local_98 = 0;
        local_118 = -1;
        local_9c = 0;
        for (; qVar10 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4)),
            local_110 < qVar10; local_110 = local_110 + 1) {
          pQVar11 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               (qsizetype)in_stack_fffffffffffffe78);
          if ((pQVar11->empty & 1U) == 0) {
            local_168 = iVar3;
            if (local_114 == 0) {
              local_168 = 0;
            }
            local_168 = local_98 + local_168;
            pQVar11 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)
                                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 (qsizetype)in_stack_fffffffffffffe78);
            local_168 = local_168 + pQVar11->minimumSize;
            in_stack_fffffffffffffe94 = OVar2;
            ppQVar13 = QList<QToolBarItem_*>::at
                                 ((QList<QToolBarItem_*> *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (qsizetype)in_stack_fffffffffffffe78);
            iVar6 = (*((*ppQVar13)->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[2])();
            local_a8 = CONCAT44(extraout_var,iVar6);
            local_a0 = perp(in_stack_fffffffffffffe84,(QSize *)in_stack_fffffffffffffe78);
            piVar12 = qMax<int>(&local_9c,&local_a0);
            local_9c = *piVar12;
            if ((local_118 != -1) && (local_80 < local_168)) {
              if ((1 < local_114) && (local_80 < local_98 + iVar3 + iVar4)) {
                in_stack_fffffffffffffe8c = iVar3;
                pQVar11 = QList<QLayoutStruct>::operator[]
                                    ((QList<QLayoutStruct> *)
                                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                     (qsizetype)in_stack_fffffffffffffe78);
                local_98 = local_98 - (in_stack_fffffffffffffe8c + pQVar11->minimumSize);
                local_110 = local_118;
              }
              break;
            }
            local_118 = local_110;
            local_114 = local_114 + 1;
            local_98 = local_168;
          }
        }
        piVar12 = qMax<int>(&local_98,&local_94);
        local_94 = *piVar12;
        local_10c = local_9c + iVar3 + local_10c;
      }
      iVar6 = pick(in_stack_fffffffffffffe94,
                   (QMargins *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_94 = iVar6 + local_12c + iVar3 + iVar4 + local_94;
      piVar12 = qMax<int>(&local_94,&local_7c);
      local_94 = *piVar12;
      if (pQVar8 != (QMainWindow *)0x0) {
        QWidget::size(in_stack_fffffffffffffe78);
        local_ac = pick(in_stack_fffffffffffffe84,(QSize *)in_stack_fffffffffffffe78);
        piVar12 = qMin<int>(&local_94,&local_ac);
        local_94 = *piVar12;
        in_stack_fffffffffffffe88 = OVar2;
      }
      iVar4 = pick(in_stack_fffffffffffffe94,
                   (QMargins *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      OVar2 = (iVar4 - iVar3) + local_10c;
      local_68 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      iVar3 = local_94;
      piVar12 = rpick(in_stack_fffffffffffffe84,(QSize *)in_stack_fffffffffffffe78);
      *piVar12 = iVar3;
      pOVar14 = (Orientation *)rperp(OVar2,(QSize *)in_stack_fffffffffffffe78);
      *pOVar14 = OVar2;
    }
    QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6fca04);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

QSize QToolBarLayout::expandedSize(const QSize &size) const
{
    if (dirty)
        updateGeomArray();

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return QSize(0, 0);
    QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget());
    Qt::Orientation o = tb->orientation();
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);

    int total_w = 0;
    int count = 0;
    for (int x = 0; x < items.size(); ++x) {
        if (!geomArray[x].empty) {
            total_w += (count == 0 ? 0 : spacing) + geomArray[x].minimumSize;
            ++count;
        }
    }
    if (count == 0)
        return QSize(0, 0);

    int min_w = pick(o, size);
    int rows = (int)qSqrt(qreal(count));
    if (rows == 1)
        ++rows;      // we want to expand to at least two rows
    int space = total_w/rows + spacing + extensionExtent;
    space = qMax(space, min_w - pick(o, margins) - handleExtent);
    if (win != nullptr)
        space = qMin(space, pick(o, win->size()) - pick(o, margins) - handleExtent);

    int w = 0;
    int h = 0;
    int i = 0;
    while (i < items.size()) {
        int count = 0;
        int size = 0;
        int prev = -1;
        int rowHeight = 0;
        for (; i < items.size(); ++i) {
            if (geomArray[i].empty)
                continue;

            int newSize = size + (count == 0 ? 0 : spacing) + geomArray[i].minimumSize;
            rowHeight = qMax(rowHeight, perp(o, items.at(i)->sizeHint()));
            if (prev != -1 && newSize > space) {
                if (count > 1 && size + spacing + extensionExtent > space) {
                    size -= spacing + geomArray[prev].minimumSize;
                    i = prev;
                }
                break;
            }

            size = newSize;
            prev = i;
            ++count;
        }

        w = qMax(size, w);
        h += rowHeight + spacing;
    }

    w += pick(Qt::Horizontal, margins) + handleExtent + spacing + extensionExtent;
    w = qMax(w, min_w);
    if (win != nullptr)
        w = qMin(w, pick(o, win->size()));
    h += pick(Qt::Vertical, margins) - spacing; //there is no spacing before the first row

    QSize result;
    rpick(o, result) = w;
    rperp(o, result) = h;
    return result;
}